

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# po_man.cpp
# Opt level: O2

void __thiscall FPolyObj::CreateSubsectorLinks(FPolyObj *this)

{
  undefined8 *puVar1;
  uint uVar2;
  side_t **ppsVar3;
  side_t *psVar4;
  line_t_conflict *plVar5;
  FPolySeg *pFVar6;
  subsector_t *psVar7;
  FPolyNode *pFVar8;
  undefined8 uVar9;
  FPolyNode *pnode;
  long lVar10;
  uint i;
  ulong uVar11;
  bool bVar12;
  float dummybbox [4];
  
  pnode = NewPolyNode();
  dummybbox[0] = 0.0;
  dummybbox[1] = 0.0;
  dummybbox[2] = 0.0;
  dummybbox[3] = 0.0;
  pnode->poly = this;
  TArray<FPolySeg,_FPolySeg>::Resize(&pnode->segs,(this->Sidedefs).Count);
  uVar2 = (this->Sidedefs).Count;
  ppsVar3 = (this->Sidedefs).Array;
  lVar10 = 4;
  for (uVar11 = 0; uVar11 < uVar2; uVar11 = uVar11 + 1) {
    psVar4 = ppsVar3[uVar11];
    plVar5 = psVar4->linedef;
    bVar12 = plVar5->sidedef[0] == psVar4;
    pFVar6 = (pnode->segs).Array;
    uVar9 = (*(undefined8 **)(plVar5->args + (ulong)!bVar12 * 2 + -0xb))[1];
    puVar1 = (undefined8 *)((long)pFVar6 + lVar10 * 8 + -0x20);
    *puVar1 = **(undefined8 **)(plVar5->args + (ulong)!bVar12 * 2 + -0xb);
    puVar1[1] = uVar9;
    uVar9 = (*(undefined8 **)(plVar5->args + (ulong)bVar12 * 2 + -0xb))[1];
    puVar1 = (undefined8 *)((long)pFVar6 + lVar10 * 8 + -0x10);
    *puVar1 = **(undefined8 **)(plVar5->args + (ulong)bVar12 * 2 + -0xb);
    puVar1[1] = uVar9;
    (&(pFVar6->v1).pos.X)[lVar10] = (double)psVar4;
    lVar10 = lVar10 + 5;
  }
  if ((i_compatflags._3_1_ & 0x40) == 0) {
    SplitPoly(pnode,nodes + (long)numnodes + -1,dummybbox);
  }
  else {
    psVar7 = this->CenterSubsector;
    pFVar8 = psVar7->polys;
    pnode->pnext = pFVar8;
    if (pFVar8 != (FPolyNode *)0x0) {
      if (pFVar8->state != 0x539) {
        __assert_fail("node->pnext->state == 1337",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/po_man.cpp"
                      ,0x869,"void FPolyObj::CreateSubsectorLinks()");
      }
      pFVar8->pprev = pnode;
    }
    pnode->pprev = (FPolyNode *)0x0;
    psVar7->polys = pnode;
    pnode->snext = pnode->poly->subsectorlinks;
    pnode->poly->subsectorlinks = pnode;
    pnode->subsector = psVar7;
  }
  return;
}

Assistant:

void FPolyObj::CreateSubsectorLinks()
{
	FPolyNode *node = NewPolyNode();
	// Even though we don't care about it, we need to initialize this
	// bounding box to something so that Valgrind won't complain about it
	// when SplitPoly modifies it.
	float dummybbox[4] = { 0 };

	node->poly = this;
	node->segs.Resize(Sidedefs.Size());

	for(unsigned i=0; i<Sidedefs.Size(); i++)
	{
		FPolySeg *seg = &node->segs[i];
		side_t *side = Sidedefs[i];

		seg->v1 = side->V1();
		seg->v2 = side->V2();
		seg->wall = side;
	}
	if (!(i_compatflags & COMPATF_POLYOBJ))
	{
		SplitPoly(node, nodes + numnodes - 1, dummybbox);
	}
	else
	{
		subsector_t *sub = CenterSubsector;

		// Link node to subsector
		node->pnext = sub->polys;
		if (node->pnext != NULL) 
		{
			assert(node->pnext->state == 1337);
			node->pnext->pprev = node;
		}
		node->pprev = NULL;
		sub->polys = node;

		// link node to polyobject
		node->snext = node->poly->subsectorlinks;
		node->poly->subsectorlinks = node;
		node->subsector = sub;
	}
}